

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<cv::Mat> *
testing::internal::ActionResultHolder<cv::Mat>::PerformAction<cv::Mat(cv::Mat,cv::Rect_<int>)>
          (Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *action,ArgumentTuple *args)

{
  ActionResultHolder<cv::Mat> *this;
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> local_d8 [6];
  ReferenceOrValueWrapper<cv::Mat> local_78;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<cv::Mat> *)operator_new(0x68);
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::Perform(local_d8,args_local);
  ReferenceOrValueWrapper<cv::Mat>::ReferenceOrValueWrapper(&local_78,(Mat *)local_d8);
  ActionResultHolder(this,&local_78);
  ReferenceOrValueWrapper<cv::Mat>::~ReferenceOrValueWrapper(&local_78);
  cv::Mat::~Mat((Mat *)local_d8);
  return this;
}

Assistant:

static ActionResultHolder*
  PerformAction(const Action<F>& action,
                const typename Function<F>::ArgumentTuple& args) {
    return new ActionResultHolder(Wrapper(action.Perform(args)));
  }